

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)0>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  int iVar1;
  int iVar2;
  size_t sVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  double dVar7;
  _Bit_type *p_Var8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  size_type sVar20;
  double *pdVar21;
  pointer pdVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  double *pdVar27;
  size_type __n;
  _Bit_type *__first_p;
  ulong *puVar28;
  vector<bool,_std::allocator<bool>_> used;
  Data2D<double> vals;
  vector<int,_std::allocator<int>_> monkey_tail;
  vector<int,_std::allocator<int>_> monkey_count;
  vector<int,_std::allocator<int>_> global_to_pnts;
  vector<double,_std::allocator<double>_> norm;
  vector<int,_std::allocator<int>_> levels;
  SplitDirections split;
  Data2D<int> dagUp;
  int local_234;
  double *local_228;
  allocator_type local_1f9;
  double *local_1f8;
  long local_1f0;
  uint local_1e4;
  uint local_1e0;
  int local_1dc;
  vector<bool,_std::allocator<bool>_> local_1d8;
  pointer local_1b0;
  Data2D<int> *local_1a8;
  pointer local_1a0;
  ulong local_198;
  long local_190;
  long local_188;
  vector<double,_std::allocator<double>_> local_180;
  vector<int,_std::allocator<int>_> local_168;
  vector<int,_std::allocator<int>_> local_148;
  ulong local_130;
  long local_128;
  vector<int,_std::allocator<int>_> local_120;
  vector<double,_std::allocator<double>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  SplitDirections local_d8;
  long local_a8;
  pointer local_a0;
  long local_98;
  long local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  double local_60;
  Data2D<int> local_58;
  
  iVar9 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  __n = (size_type)iVar9;
  sVar24 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_58.stride = CONCAT44(local_58.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_1f8 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_d8.job_directions,sVar24 * __n,(value_type_conflict3 *)&local_58,
             (allocator_type *)&local_1d8);
  pdVar27 = (double *)
            local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  __return_storage_ptr__->stride = sVar24;
  __return_storage_ptr__->num_strips = __n;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    getNormalization(&local_108,this);
    local_1e0 = 1;
    if (output == -1) {
      local_1e0 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_1f0 = (long)(int)local_1e0;
    local_1b0 = (pointer)0x0;
    local_228 = (double *)0x0;
    if (local_1f8 == (double *)0x0) {
      local_58.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_d8,local_1f0 * __n,
                 (value_type_conflict2 *)&local_58,(allocator_type *)&local_1d8);
      local_1b0 = local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_228 = (double *)
                  local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1f8 = (double *)
                  local_d8.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_1a8 = __return_storage_ptr__;
    if (criteria < refine_direction_selective) {
      if (0 < iVar9) {
        sVar3 = (this->surpluses).stride;
        pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        sVar20 = 0;
        pdVar21 = local_1f8;
        pdVar22 = pdVar4;
        do {
          if (output == -1) {
            lVar18 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar18) {
              bVar13 = true;
              lVar15 = 0;
              do {
                if (bVar13) {
                  bVar13 = (ABS(pdVar22[lVar15]) * pdVar21[lVar15]) /
                           local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar15] <= tolerance;
                }
                else {
                  bVar13 = false;
                }
                lVar15 = lVar15 + 1;
              } while (lVar18 != lVar15);
              goto LAB_001a0612;
            }
          }
          else {
            bVar13 = (ABS(pdVar4[sVar3 * sVar20 + (long)output]) * local_1f8[sVar20 * local_1f0]) /
                     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output] <= tolerance;
LAB_001a0612:
            if ((!bVar13) &&
               (lVar18 = (long)(this->super_BaseCanonicalGrid).num_dimensions, 0 < lVar18)) {
              lVar15 = 0;
              do {
                *(undefined4 *)((long)pdVar27 + lVar15) = 1;
                lVar15 = lVar15 + 4;
              } while (lVar18 * 4 != lVar15);
            }
          }
          sVar20 = sVar20 + 1;
          pdVar22 = pdVar22 + sVar3;
          pdVar21 = pdVar21 + local_1f0;
          pdVar27 = (double *)((long)pdVar27 + sVar24 * 4);
        } while (sVar20 != __n);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)0>(&local_58,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_d8,mset);
      iVar9 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_d8);
      ::std::vector<int,_std::allocator<int>_>::vector(&local_120,__n,(allocator_type *)&local_1d8);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_f0,(long)iVar9,(allocator_type *)&local_1d8);
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (ulong *)0x0;
      local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::resize(&local_148,(long)this->top_level + 1);
      ::std::vector<int,_std::allocator<int>_>::resize(&local_168,(long)this->top_level + 1);
      std::vector<bool,_std::allocator<bool>_>::resize(&local_1d8,(long)iVar9,false);
      if (0 < (int)((ulong)((long)local_d8.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_d8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_90 = (long)output;
        local_88 = __return_storage_ptr__->stride;
        local_a0 = (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_68 = (ulong)local_1e0;
        lVar18 = 0;
        local_a8 = local_90 * 8;
        do {
          iVar9 = *(int *)((long)local_d8.job_directions.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar18 * 4);
          piVar5 = local_d8.job_pnts.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar18].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          uVar25 = (ulong)((long)local_d8.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar18].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
          local_190 = local_1f0;
          uVar23 = (uint)uVar25;
          local_188 = (long)(int)uVar23;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_180,local_188 * local_1f0,&local_1f9);
          local_1a0 = piVar5;
          local_130 = uVar25;
          local_98 = lVar18;
          if (output == -1) {
            if ((int)uVar23 < 1) goto LAB_001a09da;
            uVar25 = 0;
            local_234 = 0;
            do {
              piVar5 = local_1a0;
              lVar18 = (long)(this->super_BaseCanonicalGrid).num_outputs;
              if (0 < lVar18) {
                memmove(local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + local_190 * uVar25,
                        (this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (long)local_1a0[uVar25] * (this->super_BaseCanonicalGrid).values.num_outputs
                        ,lVar18 << 3);
              }
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[piVar5[uVar25]] = (int)uVar25;
              uVar10 = (this->super_BaseCanonicalGrid).points.indexes.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(long)piVar5[uVar25] *
                                 (this->super_BaseCanonicalGrid).points.num_dimensions + (long)iVar9
                                ];
              if ((int)uVar10 < 1) {
                iVar16 = 0;
              }
              else {
                iVar16 = 0;
                do {
                  iVar16 = iVar16 + 1;
                  bVar13 = 2 < uVar10;
                  uVar10 = uVar10 / 3;
                } while (bVar13);
              }
              local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar25] = iVar16;
              if (local_234 <= iVar16) {
                local_234 = iVar16;
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != (uVar23 & 0x7fffffff));
          }
          else if ((int)uVar23 < 1) {
LAB_001a09da:
            local_234 = 0;
          }
          else {
            sVar24 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            sVar3 = (this->super_BaseCanonicalGrid).values.num_outputs;
            pdVar4 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar6 = (this->super_BaseCanonicalGrid).points.indexes.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar25 = 0;
            local_234 = 0;
            do {
              iVar16 = piVar5[uVar25];
              local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_190 * uVar25] =
                   *(double *)((long)pdVar4 + sVar3 * (long)iVar16 * 8 + local_a8);
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar16] = (int)uVar25;
              uVar10 = piVar6[(long)iVar9 + (long)piVar5[uVar25] * sVar24];
              iVar16 = 0;
              if (0 < (int)uVar10) {
                iVar16 = 0;
                do {
                  iVar16 = iVar16 + 1;
                  bVar13 = 2 < uVar10;
                  uVar10 = uVar10 / 3;
                } while (bVar13);
              }
              local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar25] = iVar16;
              if (local_234 <= iVar16) {
                local_234 = iVar16;
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != (uVar23 & 0x7fffffff));
          }
          uVar23 = (uint)local_130;
          if (0 < local_234) {
            local_1dc = iVar9 * 2;
            uVar10 = uVar23 & 0x7fffffff;
            local_80 = (ulong)(uVar10 >> 6);
            local_1e4 = uVar23 & 0x3f;
            local_78 = (ulong)((uVar10 >> 6) << 3);
            iVar16 = iVar9 * 2 + 2;
            local_70 = ~(0xffffffffffffffffU >> (-(char)local_1e4 & 0x3fU));
            local_198 = 1;
            do {
              if (0 < (int)local_130) {
                local_128 = 0;
                uVar25 = 0;
                do {
                  pdVar4 = local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar18 = local_190;
                  p_Var8 = local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar25] == (int)local_198) {
                    uVar23 = (this->super_BaseCanonicalGrid).points.indexes.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [(long)local_1a0[uVar25] *
                              (this->super_BaseCanonicalGrid).points.num_dimensions + (long)iVar9];
                    dVar7 = 1.0;
                    if (0 < (int)uVar23) {
                      iVar11 = 1;
                      uVar14 = uVar23;
                      do {
                        iVar11 = iVar11 * 3;
                        bVar13 = 2 < uVar14;
                        uVar14 = uVar14 / 3;
                      } while (bVar13);
                      dVar7 = (double)iVar11;
                    }
                    local_60 = (double)(int)((uVar23 - ((int)uVar23 >> 0x1f) & 0xfffffffe) +
                                             uVar23 * 2 + 2) * (1.0 / dVar7) + -2.0;
                    *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start = local_1dc;
                    *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start = local_1a0[uVar25];
                    if (uVar10 < 0x40) {
                      puVar28 = local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                      if (local_1e4 != 0) {
LAB_001a0ba1:
                        *puVar28 = *puVar28 & local_70;
                      }
                    }
                    else {
                      memset(local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                             local_78);
                      if (local_1e4 != 0) {
                        puVar28 = p_Var8 + local_80;
                        goto LAB_001a0ba1;
                      }
                    }
                    if (*local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start < iVar16) {
                      lVar18 = lVar18 * local_128;
                      iVar11 = 0;
                      do {
                        iVar1 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar11];
                        if (iVar1 < iVar16) {
                          iVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start
                                  [(long)local_168.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[iVar11] *
                                   local_58.stride + (long)iVar1];
                          lVar15 = (long)iVar2;
                          if (lVar15 != -1) {
                            uVar19 = (ulong)local_120.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start[lVar15];
                            uVar12 = uVar19 + 0x3f;
                            if (-1 < (long)uVar19) {
                              uVar12 = uVar19;
                            }
                            if ((local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                 [((long)uVar12 >> 6) +
                                  ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                                 >> (uVar19 & 0x3f) & 1) == 0) {
                              dVar7 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)0>
                                                (this->order,
                                                 (this->super_BaseCanonicalGrid).points.indexes.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start
                                                 [(this->super_BaseCanonicalGrid).points.
                                                  num_dimensions * lVar15 + (long)iVar9],local_60);
                              iVar1 = local_120.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[lVar15];
                              uVar12 = (ulong)iVar1;
                              if (0 < (int)local_1e0) {
                                uVar19 = 0;
                                do {
                                  *(double *)((long)pdVar4 + uVar19 * 8 + lVar18) =
                                       local_180.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [local_190 * uVar12 + uVar19] * -dVar7 +
                                       *(double *)((long)pdVar4 + uVar19 * 8 + lVar18);
                                  uVar19 = uVar19 + 1;
                                } while (local_68 != uVar19);
                              }
                              uVar19 = uVar12 + 0x3f;
                              if (-1 < (long)uVar12) {
                                uVar19 = uVar12;
                              }
                              local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                              [((long)uVar19 >> 6) +
                               ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                                   local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                   [((long)uVar19 >> 6) +
                                    ((ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001) - 1
                                    )] | 1L << ((byte)iVar1 & 0x3f);
                              local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)iVar11 + 1] = local_1dc;
                              local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[(long)iVar11 + 1] = iVar2;
                              iVar11 = iVar11 + 1;
                              goto LAB_001a0c54;
                            }
                          }
                          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar11] = iVar1 + 1;
                        }
                        else {
                          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)iVar11 + -1] =
                               local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[(long)iVar11 + -1] + 1;
                          iVar11 = iVar11 + -1;
                        }
LAB_001a0c54:
                      } while (*local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start < iVar16);
                    }
                  }
                  uVar25 = uVar25 + 1;
                  local_128 = local_128 + 8;
                } while (uVar25 != uVar10);
              }
              iVar11 = (int)local_198;
              local_198 = (ulong)(iVar11 + 1);
              uVar23 = (uint)local_130;
            } while (iVar11 != local_234);
          }
          if (0 < (int)uVar23) {
            sVar24 = (this->surpluses).stride;
            pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar25 = 0;
            pdVar22 = local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              lVar15 = (long)local_1a0[uVar25];
              lVar18 = sVar24 * lVar15;
              if (output == -1) {
                lVar26 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                bVar13 = true;
                if (0 < lVar26) {
                  lVar17 = 0;
                  do {
                    if (bVar13 == false) {
                      bVar13 = false;
                    }
                    else {
                      dVar7 = (local_1f8 + lVar15 * local_1f0)[lVar17];
                      bVar13 = true;
                      if (tolerance <
                          (ABS(pdVar4[lVar18 + lVar17]) * dVar7) /
                          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar17]) {
                        bVar13 = (dVar7 * ABS(pdVar22[lVar17])) /
                                 local_108.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar17] <= tolerance;
                      }
                    }
                    lVar17 = lVar17 + 1;
                  } while (lVar26 != lVar17);
                }
              }
              else {
                dVar7 = local_1f8[lVar15 * local_1f0];
                bVar13 = true;
                if (tolerance <
                    (ABS(pdVar4[lVar18 + local_90]) * dVar7) /
                    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_90]) {
                  bVar13 = (dVar7 * ABS(local_180.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[local_190 * uVar25])) /
                           local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_90] <= tolerance;
                }
              }
              local_a0[(long)iVar9 + lVar15 * local_88] = (uint)(bVar13 ^ 1);
              uVar25 = uVar25 + 1;
              pdVar22 = pdVar22 + local_190;
            } while (uVar25 != (uVar23 & 0x7fffffff));
          }
          if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_180.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_180.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar18 = local_98 + 1;
        } while (lVar18 < (int)((ulong)((long)local_d8.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_d8.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
        operator_delete(local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (ulong *)0x0;
        local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_1d8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_d8);
      if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_228 != (double *)0x0) {
      operator_delete(local_228,(long)local_1b0 - (long)local_228);
    }
    __return_storage_ptr__ = local_1a8;
    if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}